

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9JsonSerialize(jx9_value *pValue,SyBlob *pOut)

{
  undefined1 local_30 [8];
  json_private_data sJson;
  SyBlob *pOut_local;
  jx9_value *pValue_local;
  
  sJson.isFirst = 0;
  sJson.pOut._0_4_ = 1;
  sJson.pOut._4_4_ = 0;
  local_30 = (undefined1  [8])pOut;
  sJson._16_8_ = pOut;
  VmJsonEncode(pValue,(json_private_data *)local_30);
  return 0;
}

Assistant:

JX9_PRIVATE int jx9JsonSerialize(jx9_value *pValue,SyBlob *pOut)
{
	json_private_data sJson;
	/* Prepare the JSON data */
	sJson.nRecCount = 0;
	sJson.pOut = pOut;
	sJson.isFirst = 1;
	sJson.iFlags = 0;
	/* Perform the encoding operation */
	VmJsonEncode(pValue, &sJson);
	/* All done */
	return JX9_OK;
}